

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::initFromPath
          (BinaryRegistryWriter *this,string *srcPath)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  size_t ndx;
  long lVar4;
  size_type __n;
  ProgramBinary *this_00;
  Exception *pEVar5;
  uint uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  deUint32 index;
  UniquePtr<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> binary;
  string baseName;
  FilePath path;
  DirectoryIterator iter;
  stringstream str;
  allocator<char> local_30a;
  allocator_type local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  deUint32 local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  BinaryRegistryWriter *local_2c0;
  UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_> local_2b8;
  string local_2a8;
  FilePath local_288;
  DirectoryIterator local_268;
  long *local_238 [2];
  long local_228 [2];
  int aiStack_218 [24];
  ios_base local_1b8 [392];
  
  pcVar1 = (srcPath->_M_dataplus)._M_p;
  local_2c0 = this;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,pcVar1,pcVar1 + srcPath->_M_string_length);
  de::DirectoryIterator::DirectoryIterator(&local_268,(FilePath *)local_238);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  do {
    bVar2 = de::DirectoryIterator::hasItem(&local_268);
    if (!bVar2) {
      de::DirectoryIterator::~DirectoryIterator(&local_268);
      return;
    }
    de::DirectoryIterator::getItem(&local_288,&local_268);
    de::FilePath::getBaseName_abi_cxx11_(&local_2a8,&local_288);
    if (((((local_2a8._M_string_length == 0xe) && (*local_2a8._M_dataplus._M_p == '0')) &&
         (local_2a8._M_dataplus._M_p[1] == 'x')) &&
        ((local_2a8._M_dataplus._M_p[10] == '.' && (local_2a8._M_dataplus._M_p[0xb] == 's')))) &&
       ((local_2a8._M_dataplus._M_p[0xc] == 'p' && (local_2a8._M_dataplus._M_p[0xd] == 'v')))) {
      lVar4 = 2;
      do {
        if ((9 < (byte)(local_2a8._M_dataplus._M_p[lVar4] - 0x30U)) &&
           ((uVar6 = (byte)local_2a8._M_dataplus._M_p[lVar4] - 0x41, 0x25 < uVar6 ||
            ((0x3f0000003fU >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) goto LAB_009e4320;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 10);
      local_2e0._M_dataplus._M_p._0_4_ = 0xffffffff;
      std::__cxx11::stringstream::stringstream((stringstream *)local_238);
      *(uint *)((long)aiStack_218 + *(long *)(local_228[0] + -0x18) + 8) =
           *(uint *)((long)aiStack_218 + *(long *)(local_228[0] + -0x18) + 8) & 0xffffffb5 | 8;
      std::__cxx11::string::substr((ulong)&local_308,(ulong)&local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,local_308._M_dataplus._M_p,local_308._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      std::istream::_M_extract<unsigned_int>((uint *)local_238);
      local_2e4 = (deUint32)local_2e0._M_dataplus._M_p;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_238);
      std::ios_base::~ios_base(local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,local_288.m_path._M_dataplus._M_p,&local_30a);
      std::ifstream::ifstream
                (local_238,
                 (char *)CONCAT44(local_2e0._M_dataplus._M_p._4_4_,
                                  (deUint32)local_2e0._M_dataplus._M_p),_S_bin|_S_ate);
      __n = std::istream::tellg();
      cVar3 = std::__basic_file<char>::is_open();
      if ((cVar3 == '\0') || (*(int *)((long)aiStack_218 + local_238[0][-3]) != 0)) {
        pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
        std::operator+(&local_308,"Failed to open ",&local_2e0);
        tcu::Exception::Exception(pEVar5,&local_308);
        __cxa_throw(pEVar5,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      if (__n == 0) {
        pEVar5 = (Exception *)__cxa_allocate_exception(0x30);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_308,"Malformed binary, size = 0","");
        tcu::Exception::Exception(pEVar5,&local_308);
        __cxa_throw(pEVar5,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
      }
      std::istream::seekg((long)local_238,_S_beg);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_308,__n,&local_309)
      ;
      std::istream::read((char *)local_238,(long)local_308._M_dataplus._M_p);
      this_00 = (ProgramBinary *)operator_new(0x20);
      ProgramBinary::ProgramBinary
                (this_00,PROGRAM_FORMAT_SPIRV,
                 local_308._M_string_length - (long)local_308._M_dataplus._M_p,
                 (deUint8 *)local_308._M_dataplus._M_p);
      if ((deUint8 *)local_308._M_dataplus._M_p != (deUint8 *)0x0) {
        operator_delete(local_308._M_dataplus._M_p,
                        local_308.field_2._M_allocated_capacity - (long)local_308._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(local_238);
      local_2b8.m_data.ptr = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_2e0._M_dataplus._M_p._4_4_,(deUint32)local_2e0._M_dataplus._M_p) !=
          &local_2e0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_2e0._M_dataplus._M_p._4_4_,
                                 (deUint32)local_2e0._M_dataplus._M_p),
                        local_2e0.field_2._M_allocated_capacity + 1);
      }
      addBinary(local_2c0,local_2e4,local_2b8.m_data.ptr);
      de::details::UniqueBase<vk::ProgramBinary,_de::DefaultDeleter<vk::ProgramBinary>_>::reset
                (&local_2b8);
    }
LAB_009e4320:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288.m_path._M_dataplus._M_p != &local_288.m_path.field_2) {
      operator_delete(local_288.m_path._M_dataplus._M_p,
                      local_288.m_path.field_2._M_allocated_capacity + 1);
    }
    de::DirectoryIterator::next(&local_268);
  } while( true );
}

Assistant:

void BinaryRegistryWriter::initFromPath (const std::string& srcPath)
{
	DE_ASSERT(m_binaries.empty());

	for (de::DirectoryIterator iter(srcPath); iter.hasItem(); iter.next())
	{
		const de::FilePath	path		= iter.getItem();
		const std::string	baseName	= path.getBaseName();

		if (isProgramFileName(baseName))
		{
			const deUint32						index	= getProgramIndexFromName(baseName);
			const de::UniquePtr<ProgramBinary>	binary	(readBinary(path.getPath()));

			addBinary(index, *binary);
			// \note referenceCount is left to 0 and will only be incremented
			//		 if binary is reused (added via addProgram()).
		}
	}
}